

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::
parse_format_string<false,wchar_t,duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>>,wchar_t,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          *handler)

{
  internal *piVar1;
  ulong uVar2;
  internal *end;
  int iVar3;
  buffer<wchar_t> *pbVar4;
  size_t sVar5;
  wchar_t wVar6;
  internal *piVar7;
  internal *piVar8;
  format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *this_00;
  string *psVar9;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_1
  *this_01;
  buffer<wchar_t> *c;
  bool bVar10;
  undefined1 local_b0 [32];
  string local_90;
  string local_70;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_1
  local_50;
  undefined1 local_40 [16];
  
  this_00 = (format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
             *)format_str.size_;
  end = this + (long)format_str.data_ * 4;
  do {
    if (this == end) {
      return;
    }
    piVar8 = this;
    if (*(wchar_t *)this == L'{') {
LAB_01822fc4:
      if (this != piVar8) {
        do {
          bVar10 = this != piVar8;
          piVar7 = this;
          if (bVar10) {
            iVar3 = *(int *)this;
            while (iVar3 != 0x7d) {
              piVar7 = piVar7 + 4;
              bVar10 = piVar7 != piVar8;
              if (piVar7 == piVar8) goto LAB_01822fff;
              iVar3 = *(int *)piVar7;
            }
            bVar10 = true;
          }
LAB_01822fff:
          if (bVar10) {
            piVar1 = piVar7 + 4;
            if ((piVar1 == piVar8) || (*(wchar_t *)piVar1 != L'}')) {
              local_b0._0_8_ = local_b0 + 0x10;
              psVar9 = (string *)local_b0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_b0,"unmatched \'}\' in format string","");
              error_handler::on_error((error_handler *)psVar9,(string *)local_b0);
            }
            format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
            ::on_text(this_00,(wchar_t *)this,(wchar_t *)piVar1);
            this = piVar7 + 8;
          }
          else {
            format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
            ::on_text(this_00,(wchar_t *)this,(wchar_t *)piVar8);
          }
        } while (bVar10);
      }
      piVar8 = piVar8 + 4;
      if (piVar8 == end) {
        local_50.pointer = local_40;
        this_01 = &local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"invalid format string","");
        error_handler::on_error((error_handler *)&this_01->string,(string *)&local_50.string);
      }
      if ((char)*(int *)piVar8 == '}') {
        format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
        ::on_arg_id(this_00);
LAB_0182305e:
        format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
        ::on_replacement_field(this_00,(wchar_t *)piVar8);
      }
      else if (*(int *)piVar8 == 0x7b) {
        pbVar4 = (this_00->context).out_.container;
        sVar5 = pbVar4->size_;
        uVar2 = sVar5 + 1;
        if (pbVar4->capacity_ < uVar2) {
          (**pbVar4->_vptr_buffer)(pbVar4,uVar2);
        }
        pbVar4->size_ = uVar2;
        pbVar4->ptr_[sVar5] = *(wchar_t *)piVar8;
        (this_00->context).out_.container = pbVar4;
      }
      else {
        local_b0._0_8_ = this_00;
        piVar8 = (internal *)
                 parse_arg_id<wchar_t,duckdb_fmt::v6::internal::id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>>,wchar_t,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>>
                           ((wchar_t *)piVar8,(wchar_t *)end,
                            (id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
                             *)local_b0);
        if (piVar8 == end) {
          wVar6 = L'\0';
        }
        else {
          wVar6 = *(wchar_t *)piVar8;
        }
        if (wVar6 != L':') {
          if (wVar6 != L'}') {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            psVar9 = &local_90;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,"missing \'}\' in format string","");
            error_handler::on_error((error_handler *)psVar9,&local_90);
          }
          goto LAB_0182305e;
        }
        piVar8 = (internal *)
                 format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                 ::on_format_specs(this_00,(wchar_t *)(piVar8 + 4),(wchar_t *)end);
        if ((piVar8 == end) || (*(wchar_t *)piVar8 != L'}')) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          psVar9 = &local_70;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"unknown format specifier","");
          error_handler::on_error((error_handler *)psVar9,&local_70);
        }
      }
      this = piVar8 + 4;
      bVar10 = true;
    }
    else {
      bVar10 = true;
      wVar6 = *(wchar_t *)this;
      while (wVar6 != L'{') {
        piVar8 = piVar8 + 4;
        bVar10 = piVar8 != end;
        if (piVar8 == end) break;
        wVar6 = *(wchar_t *)piVar8;
      }
      piVar7 = this;
      if (bVar10) goto LAB_01822fc4;
      do {
        bVar10 = piVar7 != end;
        piVar8 = piVar7;
        if (bVar10) {
          wVar6 = *(wchar_t *)piVar7;
          while (wVar6 != L'}') {
            piVar8 = piVar8 + 4;
            bVar10 = piVar8 != end;
            if (piVar8 == end) goto LAB_018230ea;
            wVar6 = *(wchar_t *)piVar8;
          }
          bVar10 = true;
        }
LAB_018230ea:
        if (bVar10) {
          piVar1 = piVar8 + 4;
          if ((piVar1 == end) || (*(wchar_t *)piVar1 != L'}')) {
            local_b0._0_8_ = local_b0 + 0x10;
            psVar9 = (string *)local_b0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b0,"unmatched \'}\' in format string","");
            error_handler::on_error((error_handler *)psVar9,(string *)local_b0);
          }
          format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          ::on_text(this_00,(wchar_t *)piVar7,(wchar_t *)piVar1);
          piVar7 = piVar8 + 8;
        }
        else {
          format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          ::on_text(this_00,(wchar_t *)piVar7,(wchar_t *)end);
        }
      } while (bVar10);
      bVar10 = false;
    }
    if (!bVar10) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> format_str,
                                       Handler&& handler) {
  struct pfs_writer {
    FMT_CONSTEXPR void operator()(const Char* begin, const Char* end) {
      if (begin == end) return;
      for (;;) {
        const Char* p = nullptr;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler& handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char* p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end) return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}